

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory.cpp
# Opt level: O0

void * Rml::Detail::rmlui_align(size_t alignment,size_t size,void **ptr,size_t *space)

{
  long lVar1;
  size_t padding;
  uintptr_t aligned;
  uintptr_t pn;
  size_t *space_local;
  void **ptr_local;
  size_t size_local;
  size_t alignment_local;
  
  alignment_local = (long)*ptr + (alignment - 1) & -alignment;
  lVar1 = alignment_local - (long)*ptr;
  if (*space < size + lVar1) {
    alignment_local = 0;
  }
  else {
    *space = *space - lVar1;
    *ptr = (void *)alignment_local;
  }
  return (void *)alignment_local;
}

Assistant:

inline void* rmlui_align(size_t alignment, size_t size, void*& ptr, size_t& space)
	{
#if defined(_MSC_VER)
		return std::align(alignment, size, ptr, space);
#else
		// std::align replacement to support compilers missing this feature.
		// From https://gcc.gnu.org/bugzilla/show_bug.cgi?id=57350

		uintptr_t pn = reinterpret_cast<uintptr_t>(ptr);
		uintptr_t aligned = (pn + alignment - 1) & -alignment;
		size_t padding = aligned - pn;
		if (space < size + padding)
			return nullptr;
		space -= padding;
		return ptr = reinterpret_cast<void*>(aligned);
#endif
	}